

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O3

bool __thiscall wasm::ModuleReader::isBinaryFile(ModuleReader *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string local_238 [8];
  ifstream infile;
  undefined1 local_30 [8];
  char buffer [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  std::ifstream::ifstream(local_238);
  Path::to_path((PathString *)local_30,filename);
  std::ifstream::open(local_238,(_Ios_Openmode)local_30);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_30._4_4_,
                       CONCAT13(local_30[3],CONCAT12(local_30[2],CONCAT11(local_30[1],local_30[0])))
                      );
  if (paVar1 != &local_20) {
    operator_delete(paVar1,local_20._M_allocated_capacity + 1);
  }
  local_30[0] = '\x01';
  local_30[1] = '\x02';
  local_30[2] = '\x03';
  local_30[3] = '\x04';
  std::istream::read((char *)local_238,(long)local_30);
  std::ifstream::close();
  bVar2 = false;
  if (((local_30[0] == '\0') && (bVar2 = false, local_30[1] == 'a')) && (local_30[2] == 's')) {
    bVar2 = local_30[3] == 'm';
  }
  std::ifstream::~ifstream(local_238);
  return bVar2;
}

Assistant:

bool ModuleReader::isBinaryFile(std::string filename) {
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in | std::ifstream::binary;
  infile.open(wasm::Path::to_path(filename), flags);
  char buffer[4] = {1, 2, 3, 4};
  infile.read(buffer, 4);
  infile.close();
  return buffer[0] == '\0' && buffer[1] == 'a' && buffer[2] == 's' &&
         buffer[3] == 'm';
}